

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SendMessage.cpp
# Opt level: O1

bool __thiscall SendMessage::fillMe(SendMessage *this,string *message)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  
  iVar2 = std::__cxx11::string::compare((char *)message);
  iVar1 = this->index;
  if (iVar2 == 0) {
    if (iVar1 == 4) {
      pcVar4 = (this->super_ServerOperation).EXECUTEPENDING;
      pcVar3 = (char *)(this->super_ServerOperation).statusMessage._M_string_length;
      strlen(pcVar4);
    }
    else {
      pcVar3 = (char *)(this->super_ServerOperation).statusMessage._M_string_length;
      pcVar4 = "Invalid Input - Operation cancelled!";
    }
  }
  else {
    if (iVar1 != 3) {
      if (iVar1 == 2) {
        if (7 < message->_M_string_length - 2) {
          pcVar3 = (char *)(this->super_ServerOperation).statusMessage._M_string_length;
          pcVar4 = "Invalid Receiver - Min 1 Character andi Max 8 Characters";
          goto LAB_001063ca;
        }
        std::__cxx11::string::_M_assign((string *)&this->receiver);
        this->index = this->index + 1;
        pcVar4 = (char *)(this->super_ServerOperation).statusMessage._M_string_length;
        pcVar3 = "Subject:";
      }
      else {
        if (iVar1 != 1) {
          std::__cxx11::string::_M_append
                    ((char *)&this->message_final,(ulong)(message->_M_dataplus)._M_p);
          return true;
        }
        if (7 < message->_M_string_length - 2) {
          pcVar3 = (char *)(this->super_ServerOperation).statusMessage._M_string_length;
          pcVar4 = "Invalid Sender - MIN 1 Character and MAX 8 Characters!!!";
          goto LAB_001063ca;
        }
        std::__cxx11::string::_M_assign((string *)&this->sender);
        this->index = this->index + 1;
        pcVar4 = (char *)(this->super_ServerOperation).statusMessage._M_string_length;
        pcVar3 = "Receiver:";
      }
LAB_0010635b:
      std::__cxx11::string::_M_replace
                ((ulong)&(this->super_ServerOperation).statusMessage,0,pcVar4,(ulong)pcVar3);
      return true;
    }
    if (message->_M_string_length < 0x52) {
      std::__cxx11::string::_M_assign((string *)&this->subject);
      this->index = this->index + 1;
      pcVar4 = (char *)(this->super_ServerOperation).statusMessage._M_string_length;
      pcVar3 = "Message-Line:";
      goto LAB_0010635b;
    }
    pcVar3 = (char *)(this->super_ServerOperation).statusMessage._M_string_length;
    pcVar4 = "Invalid Subject - Max 80 Characters!";
  }
LAB_001063ca:
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_ServerOperation).statusMessage,0,pcVar3,(ulong)pcVar4);
  return false;
}

Assistant:

bool SendMessage::fillMe(string message) {
    ///check if the input from client is just a . and \n, if yes - the input from user is finished
    if(message != ".\n"){
        switch(index){
            case 1:
                ///first information for the server is the username, which is the sender
                if(message.length() <= 9 && message.length() > 1){
                    sender = message;
                    index ++;
                    ///give the client the information about the next required input.
                    statusMessage = "Receiver:";
                    return true;
                }
                ///if the input is not valid - return false and give the client information about required form for the input.
                statusMessage = "Invalid Sender - MIN 1 Character and MAX 8 Characters!!!";
                return false;
            case 2:
                ///second information the server needs is the username from the receiver
                if(message.length() <= 9 && message.length() > 1){
                    receiver = message;
                    index ++;
                    statusMessage = "Subject:";
                    return true;
                }
                statusMessage = "Invalid Receiver - Min 1 Character andi Max 8 Characters";
                return false;
            case 3:
                ///check if the 3rd input is correct, has to be the subject and not longer as 80 characters
                if(message.length() <= 81){
                    subject = message;
                    index ++;
                    statusMessage = "Message-Line:";
                    return true;
                }
                 statusMessage = "Invalid Subject - Max 80 Characters!";
                return false;
            default:
                ///the last input is the message. At each new line the message gets added to the messages before.
                message_final += message;
                return true;
        }
    }/// check if the index is 4 and all steps are done succesfully - if yes set the server status to "ready of execute" and return true
    else if(index == 4){
        statusMessage = EXECUTEPENDING;
        return false;
    }else{
        ///if something went wront in the steps above - return false and give the client the information about invalid input.
        statusMessage = "Invalid Input - Operation cancelled!";
        return false;
    }
}